

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qxdgnotificationproxy_p.cpp
# Opt level: O3

void QXdgNotificationInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  QDBusError *this;
  QDBusPendingCall *pQVar3;
  QMetaType *pQVar4;
  int iVar5;
  QDBusPendingReplyBase *this_00;
  long in_FS_OFFSET;
  QDBusPendingReply<QString,_QString,_QString,_QString> _r;
  QDBusPendingReply<> _r_1;
  QDBusReply<QString> _r_3;
  QDBusPendingReply<unsigned_int> _r_4;
  QDBusPendingReplyBase local_a8;
  QDBusPendingReplyBase local_a0;
  QArrayData *local_98;
  QArrayData *pQStack_90;
  char16_t *local_88;
  undefined8 *puStack_80;
  QArrayData *local_78;
  char16_t *pcStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  QArrayData local_38;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == ActionInvoked && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == NotificationClosed && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    goto switchD_0064f1d1_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0064f1d1_default;
  switch(_id) {
  case 0:
    local_88 = (char16_t *)_a[2];
    local_38.ref_._q_value.super___atomic_base<int>._M_i = *_a[1];
    iVar5 = 0;
    goto LAB_0064f567;
  case 1:
    local_38.ref_._q_value.super___atomic_base<int>._M_i = *_a[1];
    local_88 = (char16_t *)&local_a0;
    local_a0._0_4_ = *_a[2];
    iVar5 = 1;
LAB_0064f567:
    pQStack_90 = &local_38;
    local_98 = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)&local_98);
    goto switchD_0064f1d1_default;
  case 2:
    local_a0 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_4_ = *_a[1];
    local_98 = (QArrayData *)0x0;
    pQStack_90 = (QArrayData *)0x6cd6de;
    local_88 = (char16_t *)0x11;
    QDBusAbstractInterface::asyncCall<unsigned_int&>
              ((QDBusAbstractInterface *)&local_38,(QString *)_o,(uint *)&local_98);
    QDBusPendingReplyBase::QDBusPendingReplyBase
              ((QDBusPendingReplyBase *)&local_a0.super_QDBusPendingCall);
    QDBusPendingReplyBase::assign(&local_a0.super_QDBusPendingCall);
    if (local_a0 != (QDBusPendingReplyBase)0x0) {
      QDBusPendingReplyBase::setMetaTypes((int)&local_a0,(QMetaType *)0x0);
    }
    QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&local_38);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
    pQVar3 = (QDBusPendingCall *)*_a;
    if ((pQVar3 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar3), *(long *)pQVar3 != 0)) {
      QDBusPendingReplyBase::setMetaTypes((int)pQVar3,(QMetaType *)0x0);
    }
    this_00 = &local_a0;
    break;
  case 3:
    local_a8 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)0x0;
    pQStack_90 = (QArrayData *)0x6cd702;
    local_88 = (char16_t *)0xf;
    QDBusAbstractInterface::doAsyncCall((QString *)&local_a0,(QVariant *)_o,(ulong)&local_98);
    QDBusPendingReplyBase::QDBusPendingReplyBase
              ((QDBusPendingReplyBase *)&local_a8.super_QDBusPendingCall);
    QDBusPendingReplyBase::assign(&local_a8.super_QDBusPendingCall);
    if (local_a8 != (QDBusPendingReplyBase)0x0) {
      local_38._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QString>>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)&local_a8,(QMetaType *)0x1);
    }
    QDBusPendingCall::~QDBusPendingCall(&local_a0.super_QDBusPendingCall);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
    pQVar3 = (QDBusPendingCall *)*_a;
    if ((pQVar3 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar3), *(long *)pQVar3 != 0)) {
      local_98 = (QArrayData *)&QtPrivate::QMetaTypeInterfaceWrapper<QList<QString>>::metaType;
      iVar5 = (int)pQVar3;
      pQVar4 = (QMetaType *)0x1;
LAB_0064f518:
      QDBusPendingReplyBase::setMetaTypes(iVar5,pQVar4);
    }
    goto LAB_0064f51d;
  case 4:
    local_a8 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = (QDBusPendingReplyBase)0x0;
    local_38.alloc = 0x6cd722;
    local_28 = 0x14;
    QDBusAbstractInterface::doAsyncCall((QString *)&local_a0,(QVariant *)_o,(ulong)&local_38);
    QDBusPendingReplyBase::QDBusPendingReplyBase
              ((QDBusPendingReplyBase *)&local_a8.super_QDBusPendingCall);
    QDBusPendingReplyBase::assign(&local_a8.super_QDBusPendingCall);
    if (local_a8 != (QDBusPendingReplyBase)0x0) {
      local_98 = (QArrayData *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      pQStack_90 = (QArrayData *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_88 = (char16_t *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      puStack_80 = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)&local_a8,(QMetaType *)0x4);
    }
    QDBusPendingCall::~QDBusPendingCall(&local_a0.super_QDBusPendingCall);
    if ((QDBusPendingReplyBase)local_38._0_8_ != (QDBusPendingReplyBase)0x0) {
      LOCK();
      *(int *)local_38._0_8_ = (int)*(Type *)local_38._0_8_ + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_38._0_8_ == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_38._0_8_,2,0x10);
      }
    }
    pQVar3 = (QDBusPendingCall *)*_a;
    if ((pQVar3 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar3), *(long *)pQVar3 != 0)) {
      local_98 = (QArrayData *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      pQStack_90 = (QArrayData *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_88 = (char16_t *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      puStack_80 = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      iVar5 = (int)pQVar3;
      pQVar4 = (QMetaType *)0x4;
      goto LAB_0064f518;
    }
LAB_0064f51d:
    this_00 = &local_a8;
    break;
  case 5:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_70 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_90 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    getServerInformation
              ((QDBusReply<QString> *)&local_98,(QXdgNotificationInterface *)_o,(QString *)_a[1],
               (QString *)_a[2],(QString *)_a[3]);
    this = (QDBusError *)*_a;
    if (this != (QDBusError *)0x0) {
      QDBusError::operator=(this,(QDBusError *)&local_98);
      QString::operator=((QString *)(this + 1),(QString *)&local_58);
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (pQStack_90 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_90,2,0x10);
      }
    }
    goto switchD_0064f1d1_default;
  case 6:
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    notify((QDBusPendingReply<unsigned_int> *)&local_38,(QXdgNotificationInterface *)_o,
           (QString *)_a[1],*_a[2],(QString *)_a[3],(QString *)_a[4],(QString *)_a[5],
           (QStringList *)_a[6],(QVariantMap *)_a[7],*_a[8]);
    pQVar3 = (QDBusPendingCall *)*_a;
    if ((pQVar3 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar3), *(long *)pQVar3 != 0)) {
      local_98 = (QArrayData *)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_int>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)pQVar3,(QMetaType *)0x1);
    }
    this_00 = (QDBusPendingReplyBase *)&local_38;
    break;
  default:
    goto switchD_0064f1d1_default;
  }
  QDBusPendingReplyBase::~QDBusPendingReplyBase(this_00);
switchD_0064f1d1_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXdgNotificationInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QXdgNotificationInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ActionInvoked((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->NotificationClosed((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 2: { QDBusPendingReply<> _r = _t->closeNotification((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QStringList> _r = _t->getCapabilities();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QStringList>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<QString,QString,QString,QString> _r = _t->getServerInformation();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QString,QString,QString>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusReply<QString> _r = _t->getServerInformation((*reinterpret_cast< std::add_pointer_t<QString&>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingReply<uint> _r = _t->notify((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<QVariantMap>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[8])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<uint>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , const QString & )>(_a, &QXdgNotificationInterface::ActionInvoked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , uint )>(_a, &QXdgNotificationInterface::NotificationClosed, 1))
            return;
    }
}